

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GPIOClass.cpp
# Opt level: O1

int __thiscall GPIOClass::setdir_gpio(GPIOClass *this,string *dir)

{
  long *plVar1;
  ostream *poVar2;
  long *plVar3;
  int iVar4;
  string setdir_str;
  ofstream setdirgpio;
  long *local_238;
  long local_228;
  long lStack_220;
  undefined1 local_218 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  byte abStack_1f8 [216];
  ios_base local_120 [264];
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
                 "/sys/class/gpio/gpio",&this->gpionum);
  plVar1 = (long *)std::__cxx11::string::append((char *)local_218);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_228 = *plVar3;
    lStack_220 = plVar1[3];
    local_238 = &local_228;
  }
  else {
    local_228 = *plVar3;
    local_238 = (long *)*plVar1;
  }
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._0_8_ != &local_208) {
    operator_delete((void *)local_218._0_8_,local_208._M_allocated_capacity + 1);
  }
  std::ofstream::ofstream(local_218,(char *)local_238,_S_out);
  if ((abStack_1f8[*(long *)(local_218._0_8_ + -0x18)] & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,(dir->_M_dataplus)._M_p,dir->_M_string_length);
    iVar4 = 0;
    std::ofstream::close();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," OPERATION FAILED: Unable to set direction of GPIO",0x32);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(this->gpionum)._M_dataplus._M_p,
                        (this->gpionum)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," .",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    iVar4 = -1;
    std::ostream::flush();
  }
  local_218._0_8_ = _VTT;
  *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18)) = _connect;
  std::filebuf::~filebuf((filebuf *)(local_218 + 8));
  std::ios_base::~ios_base(local_120);
  if (local_238 != &local_228) {
    operator_delete(local_238,local_228 + 1);
  }
  return iVar4;
}

Assistant:

int GPIOClass::setdir_gpio(string dir)
{

    string setdir_str ="/sys/class/gpio/gpio" + this->gpionum + "/direction";
    ofstream setdirgpio(setdir_str.c_str()); // open direction file for gpio
        if (!setdirgpio){
            cout << " OPERATION FAILED: Unable to set direction of GPIO"<< this->gpionum <<" ."<< endl;
            return -1;
        }

        setdirgpio << dir; //write direction to direction file
        setdirgpio.close(); // close direction file
        return 0;
}